

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

void fs_event_create_files(uv_timer_t *handle)

{
  int iVar1;
  uv_timer_t *puVar2;
  int iVar3;
  int extraout_EDX;
  char *unaff_RBX;
  uv_fs_event_t *puVar4;
  uv_fs_event_t *puVar5;
  uv_timer_t *puVar6;
  uv_fs_event_t *puVar7;
  uv_fs_event_t auStack_1e8 [3];
  uv_timer_t *puStack_30;
  code *pcStack_28;
  char *pcStack_20;
  
  if (fs_event_created < 0x10) {
    unaff_RBX = fs_event_filename;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    create_file(fs_event_filename);
    if (0xe < fs_event_created) {
      fs_event_created = fs_event_created + 1;
      return;
    }
    fs_event_created = fs_event_created + 1;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,1,0);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    fs_event_create_files_cold_1();
  }
  fs_event_create_files_cold_2();
  pcStack_28 = (code *)0x1508ee;
  pcStack_20 = unaff_RBX;
  puVar2 = (uv_timer_t *)uv_default_loop();
  pcStack_28 = (code *)0x150900;
  remove("watch_dir/file2");
  pcStack_28 = (code *)0x15090f;
  remove("watch_dir/file1");
  pcStack_28 = (code *)0x15091b;
  remove("watch_dir/");
  pcStack_28 = (code *)0x150927;
  create_dir("watch_dir");
  pcStack_28 = (code *)0x15092f;
  create_file("watch_dir/file1");
  pcStack_28 = (code *)0x150937;
  create_file("watch_dir/file2");
  pcStack_28 = (code *)0x150946;
  puVar6 = puVar2;
  iVar1 = uv_fs_event_init(puVar2,&fs_event);
  if (iVar1 == 0) {
    puVar5 = &fs_event;
    pcStack_28 = (code *)0x15096a;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    puVar6 = (uv_timer_t *)puVar5;
    if (iVar1 != 0) goto LAB_00150a40;
    pcStack_28 = (code *)0x150981;
    puVar6 = puVar2;
    iVar1 = uv_timer_init(puVar2,&timer);
    if (iVar1 != 0) goto LAB_00150a45;
    puVar6 = &timer;
    pcStack_28 = (code *)0x1509a6;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    if (iVar1 != 0) goto LAB_00150a4a;
    pcStack_28 = (code *)0x1509b8;
    puVar6 = puVar2;
    uv_run(puVar2,0);
    if (fs_event_cb_called != 1) goto LAB_00150a4f;
    if (timer_cb_called != 2) goto LAB_00150a54;
    if (close_cb_called != 2) goto LAB_00150a59;
    pcStack_28 = (code *)0x1509e7;
    remove("watch_dir/file2");
    pcStack_28 = (code *)0x1509f3;
    remove("watch_dir/file1");
    pcStack_28 = (code *)0x1509ff;
    remove("watch_dir/");
    pcStack_28 = (code *)0x150a04;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_28 = (code *)0x150a18;
    uv_walk(puVar2,close_walk_cb,0);
    pcStack_28 = (code *)0x150a22;
    uv_run(puVar2,0);
    pcStack_28 = (code *)0x150a27;
    puVar6 = (uv_timer_t *)uv_default_loop();
    pcStack_28 = (code *)0x150a2f;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    pcStack_28 = (code *)0x150a40;
    run_test_fs_event_watch_file_cold_1();
LAB_00150a40:
    pcStack_28 = (code *)0x150a45;
    run_test_fs_event_watch_file_cold_2();
LAB_00150a45:
    pcStack_28 = (code *)0x150a4a;
    run_test_fs_event_watch_file_cold_3();
LAB_00150a4a:
    pcStack_28 = (code *)0x150a4f;
    run_test_fs_event_watch_file_cold_4();
LAB_00150a4f:
    pcStack_28 = (code *)0x150a54;
    run_test_fs_event_watch_file_cold_5();
LAB_00150a54:
    pcStack_28 = (code *)0x150a59;
    run_test_fs_event_watch_file_cold_6();
LAB_00150a59:
    pcStack_28 = (code *)0x150a5e;
    run_test_fs_event_watch_file_cold_7();
  }
  pcStack_28 = create_file;
  run_test_fs_event_watch_file_cold_8();
  pcStack_28 = (code *)0x182f1e;
  puVar5 = auStack_1e8;
  puVar4 = auStack_1e8;
  puVar7 = (uv_fs_event_t *)0x0;
  iVar3 = 0x41;
  puStack_30 = puVar2;
  iVar1 = uv_fs_open(0,auStack_1e8,puVar6,0x41,0x180,0);
  if (iVar1 < 0) {
    create_file_cold_1();
  }
  else {
    uv_fs_req_cleanup();
    puVar7 = (uv_fs_event_t *)0x0;
    iVar3 = 0;
    iVar1 = uv_fs_close(0,auStack_1e8,iVar1);
    puVar5 = puVar4;
    if (iVar1 == 0) {
      uv_fs_req_cleanup(auStack_1e8);
      return;
    }
  }
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar7 == &fs_event) {
    if (iVar3 != 0) goto LAB_00150b23;
    if (extraout_EDX != 2) goto LAB_00150b28;
    iVar1 = strcmp((char *)puVar5,"file2");
    if (iVar1 == 0) {
      puVar5 = &fs_event;
      iVar1 = uv_fs_event_stop(&fs_event);
      if (iVar1 == 0) {
        uv_close(&fs_event,close_cb);
        return;
      }
      goto LAB_00150b32;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_00150b23:
    fs_event_cb_file_cold_2();
LAB_00150b28:
    puVar5 = puVar7;
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00150b32:
  fs_event_cb_file_cold_5();
  if (timer_cb_called == 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file1");
    return;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file2");
  uv_close(puVar5,close_cb);
  return;
}

Assistant:

static void fs_event_create_files(uv_timer_t* handle) {
  /* Make sure we're not attempting to create files we do not intend */
  ASSERT(fs_event_created < fs_event_file_count);

  /* Create the file */
  create_file(fs_event_get_filename(fs_event_created));

  if (++fs_event_created < fs_event_file_count) {
    /* Create another file on a different event loop tick.  We do it this way
     * to avoid fs events coalescing into one fs event. */
    ASSERT(0 == uv_timer_start(&timer,
                               fs_event_create_files,
                               CREATE_TIMEOUT,
                               0));
  }
}